

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O1

void duckdb::ParquetDecodeUtils::CheckWidth(uint8_t width)

{
  InvalidInputException *this;
  string local_48;
  
  if (width < 0x41) {
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "The width (%d) of the bitpacked data exceeds the supported max width (%d), the file might be corrupted."
             ,"");
  InvalidInputException::InvalidInputException<unsigned_char,unsigned_long>
            (this,&local_48,width,0x41);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void CheckWidth(const uint8_t width) {
		if (width >= BITPACK_MASKS_SIZE) {
			throw InvalidInputException("The width (%d) of the bitpacked data exceeds the supported max width (%d), "
			                            "the file might be corrupted.",
			                            width, BITPACK_MASKS_SIZE);
		}
	}